

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>::
insert<kj::_::(anonymous_namespace)::SiPair,char_const(&)[6]>
          (HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *this,
          ArrayPtr<kj::_::(anonymous_namespace)::SiPair> table,size_t pos,char (*params) [7])

{
  undefined8 *puVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  size_t extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  HashBucket *pHVar8;
  HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *this_00;
  StringHasher *in_R9;
  HashBucket *_s944;
  HashBucket *pHVar9;
  uint uVar10;
  size_t sVar11;
  StringPtr str;
  Maybe<unsigned_long> MVar12;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  undefined8 local_38;
  
  this_00 = (HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *)table.ptr;
  if ((this_00->buckets).size_ * 2 < (this_00->erasedCount + pos) * 3 + 3) {
    rehash(this_00,pos * 3 + 3);
  }
  sVar5 = strlen((char *)in_R9);
  str.content.size_ = extraout_RDX;
  str.content.ptr = (char *)(sVar5 + 1);
  uVar4 = _::anon_unknown_0::StringHasher::hashCode(in_R9,str);
  aVar7 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)(this_00->buckets).size_;
  uVar10 = (int)aVar7.value - 1U & uVar4;
  pHVar9 = (HashBucket *)0x0;
  do {
    pHVar8 = (this_00->buckets).ptr + uVar10;
    uVar2 = pHVar8->value;
    if (uVar2 == 1) {
      if (pHVar9 == (HashBucket *)0x0) {
        pHVar9 = pHVar8;
      }
    }
    else {
      if (uVar2 == 0) {
        if (pHVar9 != (HashBucket *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          pHVar8 = pHVar9;
        }
        *pHVar8 = (HashBucket)(((ulong)uVar4 | (long)params << 0x20) + 0x200000000);
        *(undefined1 *)this = 0;
LAB_0015435f:
        MVar12.ptr.field_1.value = aVar7.value;
        MVar12.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar12.ptr;
      }
      if (pHVar8->hash == uVar4) {
        lVar6 = (ulong)(uVar2 - 2) * 0x18;
        local_38 = *(undefined8 *)(table.size_ + 0x10 + lVar6);
        puVar1 = (undefined8 *)(table.size_ + lVar6);
        local_48.ptr = (char *)*puVar1;
        local_48.size_ = puVar1[1];
        sVar5 = strlen((char *)in_R9);
        local_58.size_ = sVar5 + 1;
        bVar3 = ArrayPtr<const_char>::operator==(&local_48,&local_58);
        if (bVar3) {
          uVar4 = pHVar8->value;
          *(undefined1 *)this = 1;
          this->erasedCount = (ulong)(uVar4 - 2);
          aVar7 = extraout_RDX_00;
          goto LAB_0015435f;
        }
        aVar7 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)(this_00->buckets).size_
        ;
      }
    }
    sVar11 = (ulong)uVar10 + 1;
    uVar10 = (uint)sVar11;
    if (sVar11 == aVar7.value) {
      uVar10 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }